

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void object_suite::test_string_collector(void)

{
  basic_string_view<char,_std::char_traits<char>_> *this;
  undefined4 local_20c;
  value local_208;
  undefined1 local_203;
  undefined1 local_202 [2];
  undefined4 local_200;
  value local_1fc [2];
  undefined1 local_1f4;
  undefined1 local_1f3 [3];
  undefined4 local_1f0;
  errc local_1ec [2];
  undefined4 local_1e4;
  value local_1e0 [2];
  undefined1 local_1d8;
  undefined1 local_1d7 [3];
  undefined4 local_1d4;
  errc local_1d0 [2];
  undefined4 local_1c8;
  value local_1c4;
  undefined1 local_1bf;
  undefined1 local_1be [18];
  undefined4 local_1ac;
  value local_1a8 [2];
  undefined1 local_1a0 [8];
  string result;
  undefined1 local_170 [8];
  reader reader;
  char input [21];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x226168706c61227b;
  this = (basic_string_view<char,_std::char_traits<char>_> *)((long)&result.field_2 + 8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,(char *)&reader.stack.c.
                           super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader((basic_reader<char> *)local_170,this);
  std::__cxx11::string::string((string *)local_1a0);
  local_1a8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1ac = 0xe;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x313,"void object_suite::test_string_collector()",local_1a8,&local_1ac);
  local_1be[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1bf = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x314,"void object_suite::test_string_collector()",local_1be,&local_1bf);
  local_1c4 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1c8 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x315,"void object_suite::test_string_collector()",&local_1c4,&local_1c8);
  local_1d0[0] = trial::protocol::json::basic_reader<char>::string<std::__cxx11::string>
                           ((basic_reader<char> *)local_170,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a0);
  local_1d4 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::errc,trial::protocol::json::errc>
            ("reader.string(result)","json::errc::no_error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x316,"void object_suite::test_string_collector()",local_1d0,&local_1d4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x317,"void object_suite::test_string_collector()",local_1a0,"alpha");
  std::__cxx11::string::clear();
  local_1d7[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1d8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x319,"void object_suite::test_string_collector()",local_1d7,&local_1d8);
  local_1e0[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1e4 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31a,"void object_suite::test_string_collector()",local_1e0,&local_1e4);
  local_1ec[0] = trial::protocol::json::basic_reader<char>::string<std::__cxx11::string>
                           ((basic_reader<char> *)local_170,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a0);
  local_1f0 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::errc,trial::protocol::json::errc>
            ("reader.string(result)","json::errc::no_error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31b,"void object_suite::test_string_collector()",local_1ec,&local_1f0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[9]>
            ("result","\"hydrogen\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31c,"void object_suite::test_string_collector()",local_1a0,"hydrogen");
  local_1f3[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1f4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31d,"void object_suite::test_string_collector()",local_1f3,&local_1f4);
  local_1fc[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_200 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31e,"void object_suite::test_string_collector()",local_1fc,&local_200);
  local_202[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_203 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,799,"void object_suite::test_string_collector()",local_202,&local_203);
  local_208 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_20c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,800,"void object_suite::test_string_collector()",&local_208,&local_20c);
  std::__cxx11::string::~string((string *)local_1a0);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_170);
  return;
}

Assistant:

void test_string_collector()
{
    const char input[] = "{\"alpha\":\"hydrogen\"}";
    json::reader reader(input);
    std::string result;
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.string(result), json::errc::no_error);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
    result.clear();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.string(result), json::errc::no_error);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "hydrogen");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}